

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fverb.cpp
# Opt level: O2

void __thiscall Fverb::set_parameter(Fverb *this,uint index,float value)

{
  _Head_base<0UL,_Fverb::BasicDsp_*,_false> _Var1;
  
  if (index < 0xb) {
    _Var1._M_head_impl =
         (this->fDsp)._M_t.
         super___uniq_ptr_impl<Fverb::BasicDsp,_std::default_delete<Fverb::BasicDsp>_>._M_t.
         super__Tuple_impl<0UL,_Fverb::BasicDsp_*,_std::default_delete<Fverb::BasicDsp>_>.
         super__Head_base<0UL,_Fverb::BasicDsp_*,_false>._M_head_impl;
    switch(index) {
    case 0:
      *(float *)((long)(_Var1._M_head_impl + 0x10007) + 4) = value;
      break;
    case 1:
      *(float *)&_Var1._M_head_impl[5]._vptr_BasicDsp = value;
      return;
    case 2:
      *(float *)((long)(_Var1._M_head_impl + 0x10009) + 4) = value;
      return;
    case 3:
      *(float *)&_Var1._M_head_impl[0x1000c]._vptr_BasicDsp = value;
      return;
    case 4:
      *(float *)((long)(_Var1._M_head_impl + 0x1000e) + 4) = value;
      return;
    case 5:
      *(float *)&_Var1._M_head_impl[0x10413]._vptr_BasicDsp = value;
      return;
    case 6:
      *(float *)&_Var1._M_head_impl[0x11018]._vptr_BasicDsp = value;
      return;
    case 7:
      *(float *)((long)(_Var1._M_head_impl + 2) + 4) = value;
      return;
    case 8:
      *(float *)(&DAT_00128120 + (long)_Var1._M_head_impl) = value;
      return;
    case 9:
      *(float *)&_Var1._M_head_impl[0x2101b]._vptr_BasicDsp = value;
      return;
    case 10:
      *(float *)((long)(_Var1._M_head_impl + 0x21019) + 4) = value;
      return;
    }
  }
  return;
}

Assistant:

void Fverb::set_parameter(unsigned index, float value) noexcept
{
    mydsp &dsp = static_cast<mydsp &>(*fDsp);
    switch (index) {

    case 0:
        dsp.fHslider2 = value;
        break;

    case 1:
        dsp.fHslider1 = value;
        break;

    case 2:
        dsp.fHslider3 = value;
        break;

    case 3:
        dsp.fHslider4 = value;
        break;

    case 4:
        dsp.fHslider5 = value;
        break;

    case 5:
        dsp.fHslider6 = value;
        break;

    case 6:
        dsp.fHslider7 = value;
        break;

    case 7:
        dsp.fHslider0 = value;
        break;

    case 8:
        dsp.fHslider10 = value;
        break;

    case 9:
        dsp.fHslider9 = value;
        break;

    case 10:
        dsp.fHslider8 = value;
        break;

    default:
        (void)dsp;
        (void)value;
        break;
    }
}